

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-obj-list.c
# Opt level: O0

void object_list_show_interactive(wchar_t height,wchar_t width)

{
  region_conflict orig_area;
  wchar_t max_lines;
  wchar_t local_70;
  int local_6c;
  undefined1 local_48 [8];
  region_conflict r;
  wchar_t safe_width;
  wchar_t safe_height;
  size_t max_height;
  size_t max_width;
  object_list_t *list;
  textblock *tb;
  wchar_t width_local;
  wchar_t height_local;
  
  max_height = 0;
  _safe_width = 0;
  if ((L'\0' < height) && (L'\0' < width)) {
    tb._0_4_ = width;
    tb._4_4_ = height;
    list = (object_list_t *)textblock_new();
    max_width = (size_t)object_list_new();
    object_list_collect((object_list_t *)max_width);
    object_list_sort((object_list_t *)max_width,object_list_standard_compare);
    object_list_format_textblock
              ((object_list_t *)max_width,(textblock *)0x0,L'Ϩ',L'Ϩ',(size_t *)&safe_width,
               &max_height);
    max_lines = (wchar_t)_safe_width;
    if (max_lines + L'\x02' < tb._4_4_ + L'\xfffffffe') {
      local_6c = max_lines + L'\x02';
    }
    else {
      local_6c = tb._4_4_ + L'\xfffffffe';
    }
    r.page_rows = local_6c;
    local_70 = (wchar_t)max_height;
    if ((wchar_t)tb + L'\xfffffff3' <= local_70) {
      local_70 = (wchar_t)tb + L'\xfffffff3';
    }
    r.width = local_70;
    local_48._0_4_ = -local_70;
    local_48._4_4_ = 1;
    r.col = local_70;
    r.row = local_6c;
    object_list_format_textblock
              ((object_list_t *)max_width,(textblock *)list,max_lines,local_70,(size_t *)0x0,
               (size_t *)0x0);
    region_erase_bordered((region_conflict *)local_48);
    orig_area.row = local_48._4_4_;
    orig_area.col = local_48._0_4_;
    orig_area.width = r.col;
    orig_area.page_rows = r.row;
    textui_textblock_show((textblock *)list,orig_area,(char *)0x0);
    textblock_free((textblock *)list);
    object_list_free((object_list_t *)max_width);
  }
  return;
}

Assistant:

void object_list_show_interactive(int height, int width)
{
	textblock *tb;
	object_list_t *list;
	size_t max_width = 0, max_height = 0;
	int safe_height, safe_width;
	region r;

	if (height < 1 || width < 1)
		return;

	tb = textblock_new();
	list = object_list_new();

	object_list_collect(list);
	object_list_sort(list, object_list_standard_compare);

	/*
	 * Figure out optimal display rect. Large numbers are passed as the height
	 * and width limit so that we can calculate the maximum number of rows and
	 * columns to display the list nicely. We then adjust those values as
	 * needed to fit in the main term. Height is adjusted to account for the
	 * texblock prompt. The list is positioned on the right side of the term
	 * underneath the status line.
	 */
	object_list_format_textblock(list, NULL, 1000, 1000, &max_height,
								 &max_width);
	safe_height = MIN(height - 2, (int)max_height + 2);
	safe_width = MIN(width - 13, (int)max_width);
	r.col = -safe_width;
	r.row = 1;
	r.width = safe_width;
	r.page_rows = safe_height;

	/*
	 * Actually draw the list. We pass in max_height to the format function so
	 * that all lines will be appended to the textblock. The textblock itself
	 * will handle fitting it into the region. However, we have to pass
	 * safe_width so that the format function will pad the lines properly so
	 * that the location string is aligned to the right edge of the list.
	 */
	object_list_format_textblock(list, tb, (int)max_height, safe_width, NULL,
								 NULL);
	region_erase_bordered(&r);
	textui_textblock_show(tb, r, NULL);

	textblock_free(tb);
	object_list_free(list);
}